

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTuple.h
# Opt level: O2

void __thiscall
chrono::ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<3>_>::ChConstraintTuple_1vars
          (ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<3>_> *this,
          ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<3>_> *other)

{
  this->variables = other->variables;
  Eigen::internal::call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>
            (&this->Cq,&other->Cq);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
            (&this->Eq,&other->Eq);
  return;
}

Assistant:

ChConstraintTuple_1vars(const ChConstraintTuple_1vars& other) {
        variables = other.variables;
        Cq = other.Cq;
        Eq = other.Eq;
    }